

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

String testing::internal::String::Format(char *format,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  char *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  String SVar3;
  va_list args;
  char buffer [4096];
  undefined8 local_10d8;
  void **local_10d0;
  undefined1 *local_10c8;
  undefined1 local_10b8 [16];
  undefined8 local_10a8;
  undefined8 local_10a0;
  undefined8 local_1098;
  undefined8 local_1090;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  undefined8 local_1038;
  undefined8 local_1028;
  undefined8 local_1018;
  char local_1008 [4096];
  
  local_10c8 = local_10b8;
  if (in_AL != '\0') {
    local_1088 = in_XMM0_Qa;
    local_1078 = in_XMM1_Qa;
    local_1068 = in_XMM2_Qa;
    local_1058 = in_XMM3_Qa;
    local_1048 = in_XMM4_Qa;
    local_1038 = in_XMM5_Qa;
    local_1028 = in_XMM6_Qa;
    local_1018 = in_XMM7_Qa;
  }
  local_10d0 = &args[0].overflow_arg_area;
  local_10d8 = 0x3000000010;
  local_10a8 = in_RDX;
  local_10a0 = in_RCX;
  local_1098 = in_R8;
  local_1090 = in_R9;
  uVar1 = vsnprintf(local_1008,0x1000,in_RSI,&local_10d8);
  if (uVar1 < 0x1000) {
    ConstructNonNull((String *)format,local_1008,(ulong)uVar1);
    sVar2 = extraout_RDX_00;
  }
  else {
    String((String *)format,"<formatting error or buffer exceeded>");
    sVar2 = extraout_RDX;
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = format;
  return SVar3;
}

Assistant:

String String::Format(const char * format, ...) {
  va_list args;
  va_start(args, format);

  char buffer[4096];
  const int kBufferSize = sizeof(buffer)/sizeof(buffer[0]);

  // MSVC 8 deprecates vsnprintf(), so we want to suppress warning
  // 4996 (deprecated function) there.
#ifdef _MSC_VER  // We are using MSVC.
#pragma warning(push)          // Saves the current warning state.
#pragma warning(disable:4996)  // Temporarily disables warning 4996.
  const int size = vsnprintf(buffer, kBufferSize, format, args);
#pragma warning(pop)           // Restores the warning state.
#else  // We are not using MSVC.
  const int size = vsnprintf(buffer, kBufferSize, format, args);
#endif  // _MSC_VER
  va_end(args);

  // vsnprintf()'s behavior is not portable.  When the buffer is not
  // big enough, it returns a negative value in MSVC, and returns the
  // needed buffer size on Linux.  When there is an output error, it
  // always returns a negative value.  For simplicity, we lump the two
  // error cases together.
  if (size < 0 || size >= kBufferSize) {
    return String("<formatting error or buffer exceeded>");
  } else {
    return String(buffer, size);
  }
}